

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

int bitset_container_number_of_runs(bitset_container_t *bc)

{
  ulong uVar1;
  uint uVar2;
  int iVar3;
  long lVar4;
  ulong uVar5;
  
  iVar3 = 0;
  uVar5 = *bc->words;
  for (lVar4 = 1; uVar2 = (uint)(uVar5 >> 0x20), lVar4 != 0x400; lVar4 = lVar4 + 1) {
    uVar1 = bc->words[lVar4];
    uVar5 = uVar5 * 2 & ~uVar5;
    uVar5 = uVar5 - (uVar5 >> 1 & 0x5555555555555555);
    uVar5 = (uVar5 >> 2 & 0x3333333333333333) + (uVar5 & 0x3333333333333333);
    iVar3 = iVar3 + (uVar2 >> 0x1f & ~(uint)uVar1) +
            (uint)(byte)(((uVar5 >> 4) + uVar5 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >> 0x38);
    uVar5 = uVar1;
  }
  uVar5 = uVar5 * 2 & ~uVar5;
  uVar5 = uVar5 - (uVar5 >> 1 & 0x5555555555555555);
  uVar5 = (uVar5 >> 2 & 0x3333333333333333) + (uVar5 & 0x3333333333333333);
  return (iVar3 - ((int)uVar2 >> 0x1f)) +
         (uint)(byte)(((uVar5 >> 4) + uVar5 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >> 0x38);
}

Assistant:

int bitset_container_number_of_runs(bitset_container_t *bc) {
  int num_runs = 0;
  uint64_t next_word = bc->words[0];

  for (int i = 0; i < BITSET_CONTAINER_SIZE_IN_WORDS-1; ++i) {
    uint64_t word = next_word;
    next_word = bc->words[i+1];
    num_runs += roaring_hamming((~word) & (word << 1)) + ( (word >> 63) & ~next_word);
  }

  uint64_t word = next_word;
  num_runs += roaring_hamming((~word) & (word << 1));
  if((word & 0x8000000000000000ULL) != 0)
    num_runs++;
  return num_runs;
}